

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * jsonnet_evaluate_snippet_aux
                 (JsonnetVm *vm,char *filename,char *snippet,int *error,EvalKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  *ext_vars;
  VmNativeCallbackMap *natives;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *doc;
  _Base_ptr p_Var3;
  long lVar4;
  char *pcVar5;
  undefined8 extraout_RAX;
  StaticError *err;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int extraout_EDX;
  size_t sVar10;
  iterator __begin3_1;
  undefined8 *puVar11;
  ulong uVar12;
  uint uVar13;
  iterator __begin3;
  ulong uVar14;
  allocator<char> local_229;
  AST *expr;
  long *local_220;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  Tokens tokens;
  Allocator alloc;
  
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&alloc.allocated;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node._M_size = 0;
  alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  alloc.allocated.
  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       alloc.allocated.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>((string *)&files,filename,&local_229);
  jsonnet::internal::jsonnet_lex(&tokens,(string *)&files,snippet);
  std::__cxx11::string::~string((string *)&files);
  expr = jsonnet::internal::jsonnet_parse(&alloc,&tokens);
  jsonnet::internal::jsonnet_desugar(&alloc,&expr,&vm->tla);
  uVar13 = vm->maxStack;
  jsonnet::internal::jsonnet_static_analysis(expr);
  uVar13 = uVar13 + 2;
  ext_vars = &vm->ext;
  natives = &vm->nativeCallbacks;
  if (kind == REGULAR) {
    jsonnet::internal::jsonnet_vm_execute
              ((string *)&files,&alloc,expr,ext_vars,uVar13,(double)vm->gcMinObjects,
               vm->gcGrowthTrigger,natives,vm->importCallback,vm->importCallbackContext,
               vm->stringOutput);
    std::__cxx11::string::append((char *)&files);
    *error = 0;
    pcVar5 = from_string(vm,(string *)&files);
    std::__cxx11::string::~string((string *)&files);
  }
  else if (kind == MULTI) {
    jsonnet::internal::jsonnet_vm_execute_multi
              (&files,&alloc,expr,ext_vars,uVar13,(double)vm->gcMinObjects,vm->gcGrowthTrigger,
               natives,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
    p_Var1 = &files._M_t._M_impl.super__Rb_tree_header;
    vm = (JsonnetVm *)0x1;
    for (p_Var3 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      vm = (JsonnetVm *)
           ((long)&(p_Var3[2]._M_parent)->_M_color +
           (long)&(p_Var3[1]._M_parent)->_M_color + (long)&vm->gcGrowthTrigger + 3);
    }
    pcVar5 = (char *)malloc((size_t)vm);
    if (pcVar5 == (char *)0x0) {
      memory_panic();
LAB_0015c206:
      memory_panic();
      std::__cxx11::string::~string((string *)&files);
      std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
      ::_M_clear(&tokens.
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                );
      jsonnet::internal::Allocator::~Allocator(&alloc);
      if (extraout_EDX == 2) {
        err = (StaticError *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        poVar6 = std::operator<<((ostream *)
                                 &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,"STATIC ERROR: ");
        jsonnet::internal::operator<<(poVar6,err);
        std::endl<char,std::char_traits<char>>(poVar6);
        *error = 1;
        std::__cxx11::stringbuf::str();
      }
      else {
        if (extraout_EDX != 1) {
          _Unwind_Resume(extraout_RAX);
        }
        local_220 = (long *)__cxa_begin_catch(extraout_RAX);
        std::__cxx11::stringstream::stringstream((stringstream *)&alloc);
        poVar6 = std::operator<<((ostream *)
                                 &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,"RUNTIME ERROR: ");
        poVar6 = std::operator<<(poVar6,(string *)(local_220 + 3));
        std::endl<char,std::char_traits<char>>(poVar6);
        uVar13 = vm->maxTrace;
        uVar9 = (ulong)(uVar13 >> 1);
        uVar7 = (local_220[1] - *local_220) / 0x60;
        uVar14 = 0;
        uVar8 = uVar7;
        if ((long)uVar7 < 1) {
          uVar8 = uVar14;
        }
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          lVar4 = *local_220;
          if (((vm->maxTrace == 0) || (uVar12 < uVar9)) ||
             ((long)((uVar9 - uVar13) + uVar7) <= (long)uVar12)) {
            poVar6 = std::operator<<((ostream *)
                                     &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,"\t");
            jsonnet::internal::operator<<(poVar6,(LocationRange *)(uVar14 + lVar4));
            poVar6 = std::operator<<(poVar6,"\t");
            poVar6 = std::operator<<(poVar6,(string *)(uVar14 + lVar4 + 0x40));
LAB_0015c3da:
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          else if (uVar9 == uVar12) {
            poVar6 = std::operator<<((ostream *)
                                     &alloc.internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,"\t...");
            goto LAB_0015c3da;
          }
          uVar14 = uVar14 + 0x60;
        }
        *error = 1;
        std::__cxx11::stringbuf::str();
      }
      pcVar5 = from_string(vm,(string *)&files);
      std::__cxx11::string::~string((string *)&files);
      std::__cxx11::stringstream::~stringstream((stringstream *)&alloc);
      __cxa_end_catch();
      return pcVar5;
    }
    lVar4 = 0;
    for (p_Var3 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      p_Var2 = p_Var3[1]._M_parent;
      memcpy(pcVar5 + lVar4,*(void **)(p_Var3 + 1),(size_t)((long)&p_Var2->_M_color + 1));
      lVar4 = (long)&p_Var2->_M_color + lVar4 + 1;
      p_Var2 = p_Var3[2]._M_parent;
      memcpy(pcVar5 + lVar4,*(void **)(p_Var3 + 2),(size_t)p_Var2);
      (pcVar5 + (long)&p_Var2->_M_color + lVar4)[0] = '\n';
      (pcVar5 + (long)&p_Var2->_M_color + lVar4)[1] = '\0';
      lVar4 = (long)&p_Var2->_M_color + lVar4 + 2;
    }
    pcVar5[lVar4] = '\0';
    *error = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&files._M_t);
  }
  else {
    jsonnet::internal::jsonnet_vm_execute_stream
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&files,&alloc,expr,ext_vars,uVar13,(double)vm->gcMinObjects,vm->gcGrowthTrigger,
               natives,vm->importCallback,vm->importCallbackContext,vm->stringOutput);
    sVar10 = 1;
    for (lVar4 = files._M_t._M_impl._0_8_;
        lVar4 != files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_; lVar4 = lVar4 + 0x20) {
      sVar10 = sVar10 + *(long *)(lVar4 + 8) + 2;
    }
    pcVar5 = (char *)malloc(sVar10);
    if (pcVar5 == (char *)0x0) goto LAB_0015c206;
    lVar4 = 0;
    for (puVar11 = (undefined8 *)files._M_t._M_impl._0_8_;
        puVar11 != (undefined8 *)files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        puVar11 = puVar11 + 4) {
      sVar10 = puVar11[1];
      memcpy(pcVar5 + lVar4,(void *)*puVar11,sVar10);
      (pcVar5 + sVar10 + lVar4)[0] = '\n';
      (pcVar5 + sVar10 + lVar4)[1] = '\0';
      lVar4 = lVar4 + sVar10 + 2;
    }
    pcVar5[lVar4] = '\0';
    *error = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&files);
  }
  std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
  _M_clear(&tokens.
            super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>);
  jsonnet::internal::Allocator::~Allocator(&alloc);
  return pcVar5;
}

Assistant:

static char *jsonnet_evaluate_snippet_aux(JsonnetVm *vm, const char *filename, const char *snippet,
                                          int *error, EvalKind kind)
{
    try {
        Allocator alloc;
        AST *expr;
        Tokens tokens = jsonnet_lex(filename, snippet);

        expr = jsonnet_parse(&alloc, tokens);

        jsonnet_desugar(&alloc, expr, &vm->tla);

        unsigned max_stack = vm->maxStack;

        // For the stdlib desugaring.
        max_stack++;

        // For the TLA desugaring.
        max_stack++;

        jsonnet_static_analysis(expr);
        switch (kind) {
            case REGULAR: {
                std::string json_str = jsonnet_vm_execute(&alloc,
                                                          expr,
                                                          vm->ext,
                                                          max_stack,
                                                          vm->gcMinObjects,
                                                          vm->gcGrowthTrigger,
                                                          vm->nativeCallbacks,
                                                          vm->importCallback,
                                                          vm->importCallbackContext,
                                                          vm->stringOutput);
                json_str += "\n";
                *error = false;
                return from_string(vm, json_str);
            } break;

            case MULTI: {
                std::map<std::string, std::string> files =
                    jsonnet_vm_execute_multi(&alloc,
                                             expr,
                                             vm->ext,
                                             max_stack,
                                             vm->gcMinObjects,
                                             vm->gcGrowthTrigger,
                                             vm->nativeCallbacks,
                                             vm->importCallback,
                                             vm->importCallbackContext,
                                             vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &pair : files) {
                    sz += pair.first.length() + 1;   // include sentinel
                    sz += pair.second.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &pair : files) {
                    memcpy(&buf[i], pair.first.c_str(), pair.first.length() + 1);
                    i += pair.first.length() + 1;
                    memcpy(&buf[i], pair.second.c_str(), pair.second.length());
                    i += pair.second.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            case STREAM: {
                std::vector<std::string> documents =
                    jsonnet_vm_execute_stream(&alloc,
                                              expr,
                                              vm->ext,
                                              max_stack,
                                              vm->gcMinObjects,
                                              vm->gcGrowthTrigger,
                                              vm->nativeCallbacks,
                                              vm->importCallback,
                                              vm->importCallbackContext,
                                              vm->stringOutput);
                size_t sz = 1;  // final sentinel
                for (const auto &doc : documents) {
                    sz += doc.length() + 2;  // Add a '\n' as well as sentinel
                }
                char *buf = (char *)::malloc(sz);
                if (buf == nullptr)
                    memory_panic();
                std::ptrdiff_t i = 0;
                for (const auto &doc : documents) {
                    memcpy(&buf[i], doc.c_str(), doc.length());
                    i += doc.length();
                    buf[i] = '\n';
                    i++;
                    buf[i] = '\0';
                    i++;
                }
                buf[i] = '\0';  // final sentinel
                *error = false;
                return buf;
            } break;

            default:
                fputs("INTERNAL ERROR: bad value of 'kind', probably memory corruption.\n", stderr);
                abort();
        }

    } catch (StaticError &e) {
        std::stringstream ss;
        ss << "STATIC ERROR: " << e << std::endl;
        *error = true;
        return from_string(vm, ss.str());

    } catch (RuntimeError &e) {
        std::stringstream ss;
        ss << "RUNTIME ERROR: " << e.msg << std::endl;
        const long max_above = vm->maxTrace / 2;
        const long max_below = vm->maxTrace - max_above;
        const long sz = e.stackTrace.size();
        for (long i = 0; i < sz; ++i) {
            const auto &f = e.stackTrace[i];
            if (vm->maxTrace > 0 && i >= max_above && i < sz - max_below) {
                if (i == max_above)
                    ss << "\t..." << std::endl;
            } else {
                ss << "\t" << f.location << "\t" << f.name << std::endl;
            }
        }
        *error = true;
        return from_string(vm, ss.str());
    }

    return nullptr;  // Quiet, compiler.
}